

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void VP8InitBitReader(VP8BitReader *br,uint8_t *start,size_t size)

{
  size_t in_RDX;
  VP8BitReader *in_RSI;
  VP8BitReader *in_RDI;
  
  in_RDI->range = 0xfe;
  in_RDI->value = 0;
  in_RDI->bits = -8;
  in_RDI->eof = 0;
  VP8BitReaderSetBuffer(in_RDI,(uint8_t *)in_RSI,in_RDX);
  VP8LoadNewBytes(in_RSI);
  return;
}

Assistant:

void VP8InitBitReader(VP8BitReader* const br,
                      const uint8_t* const start, size_t size) {
  assert(br != NULL);
  assert(start != NULL);
  assert(size < (1u << 31));   // limit ensured by format and upstream checks
  br->range   = 255 - 1;
  br->value   = 0;
  br->bits    = -8;   // to load the very first 8bits
  br->eof     = 0;
  VP8BitReaderSetBuffer(br, start, size);
  VP8LoadNewBytes(br);
}